

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

double ov_time_total(OggVorbis_File *vf,int i)

{
  int iVar1;
  int i_00;
  double dVar2;
  double dVar3;
  
  dVar3 = -131.0;
  if (((1 < vf->ready_state) && (vf->seekable != 0)) && (iVar1 = vf->links, i < iVar1)) {
    if (i < 0) {
      dVar3 = 0.0;
      if (0 < iVar1) {
        i_00 = 0;
        do {
          dVar2 = ov_time_total(vf,i_00);
          dVar3 = dVar3 + dVar2;
          i_00 = i_00 + 1;
        } while (iVar1 != i_00);
      }
    }
    else {
      dVar3 = (double)vf->pcmlengths[(ulong)(uint)(i * 2) + 1] / (double)vf->vi[(uint)i].rate;
    }
  }
  return dVar3;
}

Assistant:

double ov_time_total(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable || i>=vf->links)return(OV_EINVAL);
  if(i<0){
    double acc=0;
    int i;
    for(i=0;i<vf->links;i++)
      acc+=ov_time_total(vf,i);
    return(acc);
  }else{
    return((double)(vf->pcmlengths[i*2+1])/vf->vi[i].rate);
  }
}